

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O1

void __thiscall DataContainer::BuildFileList(DataContainer *this)

{
  int iVar1;
  stat s;
  stat sStack_98;
  
  iVar1 = stat((this->current_path_)._M_dataplus._M_p,&sStack_98);
  if (iVar1 != 0) {
    return;
  }
  if ((sStack_98.st_mode._1_1_ & 0x40) == 0) {
    BuildFromFile(this);
    return;
  }
  BuildFromDirectory(this);
  return;
}

Assistant:

void DataContainer::BuildFileList()
{
   // Is this a file or a directory ?
   struct stat s;

   if (stat(current_path_.c_str(), &s) == 0)
   {
      // Directory
      if (s.st_mode & S_IFDIR)
      {
         BuildFromDirectory();
      }
      else
      {
         // Is this a compressed file ?
         BuildFromFile();
      }
   }
}